

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void cs::
     foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  char cVar1;
  element_type *peVar2;
  stack_pointer psVar3;
  char *pcVar4;
  _Elt_pointer ppsVar5;
  statement_base *psVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [11];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined *puVar24;
  char *pcVar25;
  context_t *pcVar26;
  string *psVar27;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *pfVar28;
  uint uVar29;
  char *pcVar30;
  stack_pointer this;
  _Elt_pointer ppsVar31;
  _Elt_pointer ppsVar32;
  slot_type *psVar33;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  scope_guard scope;
  pair<cs_impl::any,_cs_impl::any> local_d8;
  scope_guard local_c8;
  char *local_c0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *local_b8;
  _Map_pointer local_b0;
  context_t *local_a8;
  any local_a0;
  string *local_98;
  
  local_b8 = body;
  pfVar28 = cs_impl::any::
            const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                      (obj);
  if ((pfVar28->
      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      ).
      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
      .size_ != 0) {
    peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2->break_block == true) {
      peVar2->break_block = false;
    }
    if (peVar2->continue_block == true) {
      peVar2->continue_block = false;
    }
    psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
    this = &(peVar2->super_runtime_type).storage.m_data;
    if (psVar3 != (stack_pointer)0x0) {
      this = psVar3;
    }
    local_c8.context = context;
    stack_type<cs::domain_type,_std::allocator>::push<>(this);
    pfVar28 = cs_impl::any::
              const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                        (obj);
    pcVar4 = (pfVar28->
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ).
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             .ctrl_;
    psVar33 = (pfVar28->
              super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ).
              super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              .slots_;
    cVar1 = *pcVar4;
    pcVar30 = pcVar4;
    while (cVar1 < -1) {
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar30 < (char)iVar12);
      in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Be = -(pcVar30[4] < (char)iVar13);
      in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar13 >> 0x18));
      in_XMM1_Bi = -(pcVar30[8] < (char)iVar14);
      in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar14 >> 8));
      in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar14 >> 0x10));
      in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar14 >> 0x18));
      in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar15);
      in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar15 >> 8));
      in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar15 >> 0x10));
      in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar15 >> 0x18));
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar22[1] = in_XMM1_Bd;
      auVar22[0] = in_XMM1_Bc;
      auVar22[2] = in_XMM1_Be;
      auVar22[3] = in_XMM1_Bf;
      auVar22[4] = in_XMM1_Bg;
      auVar22[5] = in_XMM1_Bh;
      auVar22[6] = in_XMM1_Bi;
      auVar22[7] = in_XMM1_Bj;
      auVar22[8] = in_XMM1_Bk;
      auVar22[9] = in_XMM1_Bl;
      auVar22[10] = in_XMM1_Bm;
      auVar22[0xb] = in_XMM1_Bn;
      auVar22[0xc] = in_XMM1_Bo;
      auVar22[0xd] = in_XMM1_Bp;
      auVar20[1] = in_XMM1_Be;
      auVar20[0] = in_XMM1_Bd;
      auVar20[2] = in_XMM1_Bf;
      auVar20[3] = in_XMM1_Bg;
      auVar20[4] = in_XMM1_Bh;
      auVar20[5] = in_XMM1_Bi;
      auVar20[6] = in_XMM1_Bj;
      auVar20[7] = in_XMM1_Bk;
      auVar20[8] = in_XMM1_Bl;
      auVar20[9] = in_XMM1_Bm;
      auVar20[10] = in_XMM1_Bn;
      auVar20[0xb] = in_XMM1_Bo;
      auVar20[0xc] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bf;
      auVar18[0] = in_XMM1_Be;
      auVar18[2] = in_XMM1_Bg;
      auVar18[3] = in_XMM1_Bh;
      auVar18[4] = in_XMM1_Bi;
      auVar18[5] = in_XMM1_Bj;
      auVar18[6] = in_XMM1_Bk;
      auVar18[7] = in_XMM1_Bl;
      auVar18[8] = in_XMM1_Bm;
      auVar18[9] = in_XMM1_Bn;
      auVar18[10] = in_XMM1_Bo;
      auVar18[0xb] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bg;
      auVar16[0] = in_XMM1_Bf;
      auVar16[2] = in_XMM1_Bh;
      auVar16[3] = in_XMM1_Bi;
      auVar16[4] = in_XMM1_Bj;
      auVar16[5] = in_XMM1_Bk;
      auVar16[6] = in_XMM1_Bl;
      auVar16[7] = in_XMM1_Bm;
      auVar16[8] = in_XMM1_Bn;
      auVar16[9] = in_XMM1_Bo;
      auVar16[10] = in_XMM1_Bp;
      uVar29 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar22 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar20 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar18 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar7 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      psVar33 = (slot_type *)((long)psVar33 + (ulong)(uVar7 << 4));
      cVar1 = pcVar30[uVar7];
      pcVar30 = pcVar30 + uVar7;
    }
    pcVar25 = pcVar4 + (pfVar28->
                       super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                       ).
                       super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                       .capacity_;
    pcVar26 = context;
    psVar27 = iterator;
    if (pcVar30 !=
        pcVar4 + (pfVar28->
                 super_raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 ).
                 super_raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 .capacity_) {
      do {
        local_98 = psVar27;
        local_a8 = pcVar26;
        local_c0 = pcVar25;
        local_d8.first.mDat = (psVar33->value).first.mDat;
        if (local_d8.first.mDat != (proxy *)0x0) {
          (local_d8.first.mDat)->refcount = (local_d8.first.mDat)->refcount + 1;
        }
        local_d8.second.mDat = (psVar33->value).second.mDat;
        if (local_d8.second.mDat != (proxy *)0x0) {
          (local_d8.second.mDat)->refcount = (local_d8.second.mDat)->refcount + 1;
        }
        puVar24 = current_process;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar24 + 0xf8),(void *)0x0);
        }
        peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        cs_impl::any::any<std::pair<cs_impl::any,cs_impl::any>>(&local_a0,&local_d8);
        domain_manager::add_var_no_return<std::__cxx11::string_const&>
                  (&(peVar2->super_runtime_type).storage,iterator,&local_a0);
        cs_impl::any::recycle(&local_a0);
        ppsVar32 = (local_b8->
                   super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
        ppsVar5 = (local_b8->
                  super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (ppsVar32 != ppsVar5) {
          ppsVar31 = (local_b8->
                     super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          local_b0 = (local_b8->
                     super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            puVar24 = current_process;
            psVar6 = *ppsVar32;
            if ((*current_process & 1) != 0) {
              LOCK();
              *current_process = 0;
              UNLOCK();
              event_type::touch((event_type *)(puVar24 + 0xf8),(void *)0x0);
            }
            (*psVar6->_vptr_statement_base[3])(psVar6);
            peVar2 = (((local_a8->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->instance).
                     super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar2->return_fcall != false) {
LAB_001735a3:
              cs_impl::any::recycle(&local_d8.second);
              cs_impl::any::recycle(&local_d8.first);
              goto LAB_001735b5;
            }
            if (peVar2->break_block == true) {
              peVar2->break_block = false;
              goto LAB_001735a3;
            }
            if (peVar2->continue_block != false) {
              peVar2->continue_block = false;
              break;
            }
            ppsVar32 = ppsVar32 + 1;
            if (ppsVar32 == ppsVar31) {
              ppsVar32 = local_b0[1];
              local_b0 = local_b0 + 1;
              ppsVar31 = ppsVar32 + 0x40;
            }
          } while (ppsVar32 != ppsVar5);
        }
        domain_manager::next_domain
                  (&((((((local_c8.context)->
                        super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_runtime_type).storage);
        iterator = local_98;
        context = local_a8;
        cs_impl::any::recycle(&local_d8.second);
        cs_impl::any::recycle(&local_d8.first);
        psVar33 = psVar33 + 1;
        cVar1 = pcVar30[1];
        pcVar30 = pcVar30 + 1;
        while (cVar1 < -1) {
          iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                          == CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
          iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                          == CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
          iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                          == CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
          iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar30 < (char)iVar12);
          in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar12 >> 8));
          in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar12 >> 0x10));
          in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar12 >> 0x18));
          in_XMM1_Be = -(pcVar30[4] < (char)iVar13);
          in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar13 >> 8));
          in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar13 >> 0x10));
          in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar13 >> 0x18));
          in_XMM1_Bi = -(pcVar30[8] < (char)iVar14);
          in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar14 >> 8));
          in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar14 >> 0x10));
          in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar14 >> 0x18));
          in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar15);
          in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar15 >> 8));
          in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar15 >> 0x10));
          in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar15 >> 0x18));
          auVar10[1] = in_XMM1_Bb;
          auVar10[0] = in_XMM1_Ba;
          auVar10[2] = in_XMM1_Bc;
          auVar10[3] = in_XMM1_Bd;
          auVar10[4] = in_XMM1_Be;
          auVar10[5] = in_XMM1_Bf;
          auVar10[6] = in_XMM1_Bg;
          auVar10[7] = in_XMM1_Bh;
          auVar10[8] = in_XMM1_Bi;
          auVar10[9] = in_XMM1_Bj;
          auVar10[10] = in_XMM1_Bk;
          auVar10[0xb] = in_XMM1_Bl;
          auVar10[0xc] = in_XMM1_Bm;
          auVar10[0xd] = in_XMM1_Bn;
          auVar10[0xe] = in_XMM1_Bo;
          auVar10[0xf] = in_XMM1_Bp;
          auVar11[1] = in_XMM1_Bb;
          auVar11[0] = in_XMM1_Ba;
          auVar11[2] = in_XMM1_Bc;
          auVar11[3] = in_XMM1_Bd;
          auVar11[4] = in_XMM1_Be;
          auVar11[5] = in_XMM1_Bf;
          auVar11[6] = in_XMM1_Bg;
          auVar11[7] = in_XMM1_Bh;
          auVar11[8] = in_XMM1_Bi;
          auVar11[9] = in_XMM1_Bj;
          auVar11[10] = in_XMM1_Bk;
          auVar11[0xb] = in_XMM1_Bl;
          auVar11[0xc] = in_XMM1_Bm;
          auVar11[0xd] = in_XMM1_Bn;
          auVar11[0xe] = in_XMM1_Bo;
          auVar11[0xf] = in_XMM1_Bp;
          auVar23[1] = in_XMM1_Bd;
          auVar23[0] = in_XMM1_Bc;
          auVar23[2] = in_XMM1_Be;
          auVar23[3] = in_XMM1_Bf;
          auVar23[4] = in_XMM1_Bg;
          auVar23[5] = in_XMM1_Bh;
          auVar23[6] = in_XMM1_Bi;
          auVar23[7] = in_XMM1_Bj;
          auVar23[8] = in_XMM1_Bk;
          auVar23[9] = in_XMM1_Bl;
          auVar23[10] = in_XMM1_Bm;
          auVar23[0xb] = in_XMM1_Bn;
          auVar23[0xc] = in_XMM1_Bo;
          auVar23[0xd] = in_XMM1_Bp;
          auVar21[1] = in_XMM1_Be;
          auVar21[0] = in_XMM1_Bd;
          auVar21[2] = in_XMM1_Bf;
          auVar21[3] = in_XMM1_Bg;
          auVar21[4] = in_XMM1_Bh;
          auVar21[5] = in_XMM1_Bi;
          auVar21[6] = in_XMM1_Bj;
          auVar21[7] = in_XMM1_Bk;
          auVar21[8] = in_XMM1_Bl;
          auVar21[9] = in_XMM1_Bm;
          auVar21[10] = in_XMM1_Bn;
          auVar21[0xb] = in_XMM1_Bo;
          auVar21[0xc] = in_XMM1_Bp;
          auVar19[1] = in_XMM1_Bf;
          auVar19[0] = in_XMM1_Be;
          auVar19[2] = in_XMM1_Bg;
          auVar19[3] = in_XMM1_Bh;
          auVar19[4] = in_XMM1_Bi;
          auVar19[5] = in_XMM1_Bj;
          auVar19[6] = in_XMM1_Bk;
          auVar19[7] = in_XMM1_Bl;
          auVar19[8] = in_XMM1_Bm;
          auVar19[9] = in_XMM1_Bn;
          auVar19[10] = in_XMM1_Bo;
          auVar19[0xb] = in_XMM1_Bp;
          auVar17[1] = in_XMM1_Bg;
          auVar17[0] = in_XMM1_Bf;
          auVar17[2] = in_XMM1_Bh;
          auVar17[3] = in_XMM1_Bi;
          auVar17[4] = in_XMM1_Bj;
          auVar17[5] = in_XMM1_Bk;
          auVar17[6] = in_XMM1_Bl;
          auVar17[7] = in_XMM1_Bm;
          auVar17[8] = in_XMM1_Bn;
          auVar17[9] = in_XMM1_Bo;
          auVar17[10] = in_XMM1_Bp;
          uVar29 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar23 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar21 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar19 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar7 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          psVar33 = (slot_type *)((long)psVar33 + (ulong)(uVar7 << 4));
          cVar1 = pcVar30[uVar7];
          pcVar30 = pcVar30 + uVar7;
        }
        pcVar25 = local_c0;
        pcVar26 = local_a8;
        psVar27 = local_98;
      } while (pcVar30 != local_c0);
    }
LAB_001735b5:
    scope_guard::~scope_guard(&local_c8);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}